

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall
google::protobuf::DynamicMessageFactory::DynamicMessageFactory
          (DynamicMessageFactory *this,DescriptorPool *pool)

{
  DescriptorPool *pool_local;
  DynamicMessageFactory *this_local;
  
  MessageFactory::MessageFactory(&this->super_MessageFactory);
  (this->super_MessageFactory)._vptr_MessageFactory =
       (_func_int **)&PTR__DynamicMessageFactory_0082a988;
  this->pool_ = pool;
  this->delegate_to_generated_factory_ = false;
  absl::lts_20250127::
  flat_hash_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
  ::flat_hash_map(&this->prototypes_);
  absl::lts_20250127::Mutex::Mutex(&this->prototypes_mutex_);
  return;
}

Assistant:

DynamicMessageFactory::DynamicMessageFactory(
    const DescriptorPool* PROTOBUF_NONNULL pool)
    : pool_(pool), delegate_to_generated_factory_(false) {}